

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O3

int os_system_linux_netlink_send(os_system_netlink *nl,nlmsghdr *nl_hdr)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  
  _seq_used = _seq_used + 1 & 0x7fffffff;
  uVar3 = (ulong)nl->used_by->logging;
  if (((&log_global_mask)[uVar3] & 1) != 0) {
    oonf_log(1,uVar3,"src/base/os_linux/os_system_linux.c",0x171,0,0,
             "Prepare to send netlink \'%s\' message %u (%u bytes)",nl->name,_seq_used,
             nl_hdr->nlmsg_len);
  }
  nl_hdr->nlmsg_seq = _seq_used;
  *(byte *)&nl_hdr->nlmsg_flags = (byte)nl_hdr->nlmsg_flags | 6;
  uVar3 = (ulong)nl_hdr->nlmsg_len;
  sVar1 = (nl->out)._len;
  iVar2 = getpagesize();
  if ((ulong)(long)iVar2 < sVar1 + uVar3) {
    _enqueue_netlink_buffer(nl);
    uVar3 = (ulong)nl_hdr->nlmsg_len;
  }
  abuf_memcpy(&nl->out,nl_hdr,uVar3);
  uVar3 = (ulong)nl->used_by->logging;
  if (((&log_global_mask)[uVar3] & 1) != 0) {
    oonf_log(1,uVar3,"src/base/os_linux/os_system_linux.c",0x17b,nl_hdr,nl_hdr->nlmsg_len,
             "Content of netlink \'%s\' message:",nl->name);
  }
  nl->out_messages = nl->out_messages + 1;
  if (nl->msg_in_transit == 0) {
    oonf_socket_set_write(&nl->socket,true);
  }
  return _seq_used;
}

Assistant:

int
os_system_linux_netlink_send(struct os_system_netlink *nl, struct nlmsghdr *nl_hdr) {
  _seq_used = (_seq_used + 1) & INT32_MAX;
  OONF_DEBUG(
    nl->used_by->logging, "Prepare to send netlink '%s' message %u (%u bytes)", nl->name, _seq_used, nl_hdr->nlmsg_len);

  nl_hdr->nlmsg_seq = _seq_used;
  nl_hdr->nlmsg_flags |= NLM_F_ACK | NLM_F_MULTI;

  if (nl_hdr->nlmsg_len + abuf_getlen(&nl->out) > (size_t)getpagesize()) {
    _enqueue_netlink_buffer(nl);
  }
  abuf_memcpy(&nl->out, nl_hdr, nl_hdr->nlmsg_len);

  OONF_DEBUG_HEX(nl->used_by->logging, nl_hdr, nl_hdr->nlmsg_len, "Content of netlink '%s' message:", nl->name);

  nl->out_messages++;

  /* trigger write */
  if (nl->msg_in_transit == 0) {
    oonf_socket_set_write(&nl->socket, true);
  }
  return _seq_used;
}